

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewFixed
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayNewFixed *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  undefined1 type [8];
  Expression **childp;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  wasm::Type::getHeapType
            (&(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type);
  HeapType::getArray((HeapType *)local_40);
  type = local_40;
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
           .usedElements;
  local_40 = (undefined1  [8])&curr->values;
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])&curr->values))) {
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
             operator*((Iterator *)local_40);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,childp,(Type)type);
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    auto type = curr->type.getHeapType().getArray().element.type;
    for (auto& expr : curr->values) {
      note(&expr, type);
    }
  }